

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_assignAllIdsNonblankModel_Test::TestBody(Annotator_assignAllIdsNonblankModel_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  element_type *peVar5;
  AssertHelper local_118 [8];
  Message local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0 [8];
  unsigned_long local_c8 [2];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_88 [8];
  Message local_80 [15];
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  AnnotatorPtr annotator;
  undefined1 local_40 [8];
  ModelPtr model;
  PrinterPtr printer;
  ParserPtr parser;
  Annotator_assignAllIdsNonblankModel_Test *this_local;
  
  this_00 = &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  libcellml::Printer::create();
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_40);
  libcellml::Annotator::create();
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignAllIds((shared_ptr *)peVar3);
  local_71 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar2) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_70,"annotator->assignAllIds(model)",
               "true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x65c,pcVar4);
    testing::internal::AssertHelper::operator=(local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_c8[1] = 0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_.message_);
  local_c8[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_b8,"size_t(0)","annotator->errorCount()",local_c8 + 1,local_c8
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar2) {
    testing::Message::Message(local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x65d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_108,SUB81(peVar5,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_e8,"modelStringUniqueIds","printer->printModel(model)",
             &modelStringUniqueIds_abi_cxx11_,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(local_110);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x65e,pcVar4);
    testing::internal::AssertHelper::operator=(local_118,local_110);
    testing::internal::AssertHelper::~AssertHelper(local_118);
    testing::Message::~Message(local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

TEST(Annotator, assignAllIdsNonblankModel)
{
    auto parser = libcellml::Parser::create();
    auto printer = libcellml::Printer::create();
    auto model = parser->parseModel(modelStringUniqueIds);
    auto annotator = libcellml::Annotator::create();

    EXPECT_FALSE(annotator->assignAllIds(model));
    EXPECT_EQ(size_t(0), annotator->errorCount());
    EXPECT_EQ(modelStringUniqueIds, printer->printModel(model));
}